

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O2

REF_STATUS meshb_pos(FILE *file,REF_INT version,REF_FILEPOS *pos)

{
  size_t sVar1;
  undefined8 uVar2;
  char *pcVar3;
  int temp_int;
  long temp_long;
  
  if (version < 3) {
    sVar1 = fread(&temp_int,4,1,(FILE *)file);
    if (sVar1 != 1) {
      pcVar3 = "read double";
      uVar2 = 0x573;
      goto LAB_001b66f3;
    }
    temp_long = (long)temp_int;
  }
  else {
    sVar1 = fread(&temp_long,8,1,(FILE *)file);
    if (sVar1 != 1) {
      pcVar3 = "read long";
      uVar2 = 0x570;
LAB_001b66f3:
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             uVar2,"meshb_pos",pcVar3,1,sVar1);
      return 1;
    }
  }
  *pos = temp_long;
  return 0;
}

Assistant:

static REF_STATUS meshb_pos(FILE *file, REF_INT version, REF_FILEPOS *pos) {
  int temp_int;
  long temp_long;

  if (3 <= version) {
    REIS(1, fread(&temp_long, sizeof(temp_long), 1, file), "read long");
    *pos = temp_long;
  } else {
    REIS(1, fread(&temp_int, sizeof(temp_int), 1, file), "read double");
    *pos = temp_int;
  }

  return REF_SUCCESS;
}